

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

void Js::JavascriptObject::CopyDataPropertiesForProxyObjects<false>
               (RecyclableObject *from,RecyclableObject *to,BVSparse<Memory::Recycler> *excluded,
               ScriptContext *scriptContext)

{
  BVIndex i;
  code *pcVar1;
  undefined4 *puVar2;
  bool bVar3;
  BOOLEAN BVar4;
  int iVar5;
  BOOL BVar6;
  JavascriptArray *pJVar7;
  undefined4 extraout_var;
  uint uVar8;
  ulong uVar9;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  Var local_60;
  Var propValue;
  undefined4 *local_50;
  BVSparse<Memory::Recycler> *local_48;
  Type local_3c;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  Var aValue;
  
  propertyDescriptor._40_8_ = to;
  propValue = from;
  pJVar7 = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from,scriptContext);
  local_3c = (pJVar7->super_ArrayObject).length;
  uVar9 = 0;
  local_38 = (PropertyRecord *)0x0;
  local_60 = (Var)0x0;
  if (local_3c != 0) {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_48 = excluded;
    do {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
      iVar5 = (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar7,uVar9);
      aValue = (Var)CONCAT44(extraout_var,iVar5);
      bVar3 = VarIs<Js::JavascriptSymbol>(aValue);
      if (!bVar3) {
        bVar3 = VarIs<Js::JavascriptString>(aValue);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar2 = local_50;
          *local_50 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x6ed,
                                      "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                      ,
                                      "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                     );
          if (!bVar3) goto LAB_00cfb72e;
          *puVar2 = 0;
          excluded = local_48;
        }
      }
      JavascriptConversion::ToPropertyKey(aValue,scriptContext,&local_38,(PropertyString **)0x0);
      i = local_38->pid;
      if (i == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar2 = local_50;
        *local_50 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x6f1,"(propertyId != Constants::NoProperty)",
                                    "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty."
                                   );
        if (!bVar3) {
LAB_00cfb72e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar2 = 0;
        excluded = local_48;
      }
      if (excluded == (BVSparse<Memory::Recycler> *)0x0) {
LAB_00cfb6b3:
        BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)propValue,local_38->pid,scriptContext,
                           (PropertyDescriptor *)local_98);
        if (BVar6 != 0) {
          bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98);
          if (bVar3) {
            BVar6 = JavascriptOperators::GetOwnProperty
                              (propValue,i,&local_60,scriptContext,(PropertyValueInfo *)0x0);
            if (BVar6 == 0) {
LAB_00cfb730:
              JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec36,L"Object.Spread");
            }
            BVar6 = CreateDataProperty((RecyclableObject *)propertyDescriptor._40_8_,i,local_60,
                                       scriptContext);
            if (BVar6 == 0) goto LAB_00cfb730;
          }
        }
      }
      else {
        BVar4 = BVSparse<Memory::Recycler>::Test(excluded,i);
        if (BVar4 == '\0') goto LAB_00cfb6b3;
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (local_3c != uVar8);
  }
  return;
}

Assistant:

void JavascriptObject::CopyDataPropertiesForProxyObjects(RecyclableObject* from, RecyclableObject* to, const BVSparse<Recycler>* excluded, ScriptContext* scriptContext)
{
    // Steps 4 and 5 of CopyDataPropertiesHelper
    JavascriptArray *keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(from, scriptContext);
    uint32 length = keys->GetLength();
    Var nextKey;
    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var propValue = nullptr;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        // Spec doesn't strictly call for us to use ToPropertyKey but since we know nextKey is already a symbol or string primitive, ToPropertyKey will be a nop and return us the propertyRecord
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "CopyDataPropertiesForProxyObjects - OwnPropertyKeys returned a propertyId with value NoProperty.");

        bool found = false;
        if (excluded)
        {
            found = excluded->Test(propertyId);
        }
        if (!found)
        {
            if (JavascriptOperators::GetOwnPropertyDescriptor(from, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    if (!JavascriptOperators::GetOwnProperty(from, propertyId, &propValue, scriptContext, nullptr))
                    {
                        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                    }
                    if (assign)
                    {
                        if (!JavascriptOperators::SetProperty(to, to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                    else
                    {
                        if (!CreateDataProperty(to, propertyId, propValue, scriptContext))
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, GetCopyDataPropertiesEntryName<assign>());
                        }
                    }
                }
            }
        }
    }
}